

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QWidgetItemData>::emplace<QWidgetItemData_const&>
          (QMovableArrayOps<QWidgetItemData> *this,qsizetype i,QWidgetItemData *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  Inserter *in_RDX;
  QWidgetItemData *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QWidgetItemData tmp;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff8e;
  byte bVar6;
  Inserter *this_00;
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<QWidgetItemData>::needsDetach
                    ((QArrayDataPointer<QWidgetItemData> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<QWidgetItemData>::freeSpaceAtEnd
                          ((QArrayDataPointer<QWidgetItemData> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff8e,
                                                   CONCAT24(in_stack_ffffffffffffff8c,
                                                            in_stack_ffffffffffffff88)))),
       qVar3 != 0)) {
      QArrayDataPointer<QWidgetItemData>::end((QArrayDataPointer<QWidgetItemData> *)in_RDI);
      QWidgetItemData::QWidgetItemData
                ((QWidgetItemData *)in_RDI,
                 (QWidgetItemData *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      in_RDI->displaceTo = (QWidgetItemData *)((long)&in_RDI->displaceTo->role + 1);
      goto LAB_008aeb58;
    }
    if ((in_RSI == (QWidgetItemData *)0x0) &&
       (qVar3 = QArrayDataPointer<QWidgetItemData>::freeSpaceAtBegin
                          ((QArrayDataPointer<QWidgetItemData> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff8e,
                                                   CONCAT24(in_stack_ffffffffffffff8c,
                                                            in_stack_ffffffffffffff88)))),
       qVar3 != 0)) {
      QArrayDataPointer<QWidgetItemData>::begin((QArrayDataPointer<QWidgetItemData> *)0x8aea2a);
      QWidgetItemData::QWidgetItemData
                ((QWidgetItemData *)in_RDI,
                 (QWidgetItemData *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      (((QVariant *)&in_RDI->displaceFrom)->d).data.shared =
           (((QVariant *)&in_RDI->displaceFrom)->d).data.shared + -0x28;
      in_RDI->displaceTo = (QWidgetItemData *)((long)&in_RDI->displaceTo->role + 1);
      goto LAB_008aeb58;
    }
  }
  memset(local_30,0xaa,0x28);
  QWidgetItemData::QWidgetItemData
            ((QWidgetItemData *)in_RDI,
             (QWidgetItemData *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  bVar4 = in_RDI->displaceTo != (QWidgetItemData *)0x0;
  uVar5 = bVar4 && in_RSI == (QWidgetItemData *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QWidgetItemData *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QWidgetItemData>::detachAndGrow
            ((QArrayDataPointer<QWidgetItemData> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),
             (qsizetype)in_RDX,
             (QWidgetItemData **)
             CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff8c,uVar2))),
             (QArrayDataPointer<QWidgetItemData> *)in_RDI);
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<QWidgetItemData> *)
                              CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff8c,uVar2
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar5,in_stack_ffffffffffffff78));
    Inserter::insertOne(in_RDI,(QWidgetItemData *)CONCAT17(uVar5,in_stack_ffffffffffffff78));
    Inserter::~Inserter(in_RDI);
  }
  else {
    QArrayDataPointer<QWidgetItemData>::begin((QArrayDataPointer<QWidgetItemData> *)0x8aeaec);
    QWidgetItemData::QWidgetItemData
              ((QWidgetItemData *)in_RDI,
               (QWidgetItemData *)CONCAT17(uVar5,in_stack_ffffffffffffff78));
    (((QVariant *)&in_RDI->displaceFrom)->d).data.shared =
         (((QVariant *)&in_RDI->displaceFrom)->d).data.shared + -0x28;
    in_RDI->displaceTo = (QWidgetItemData *)((long)&in_RDI->displaceTo->role + 1);
  }
  QWidgetItemData::~QWidgetItemData((QWidgetItemData *)0x8aeb58);
LAB_008aeb58:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }